

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicyULT.cpp
# Opt level: O3

void __thiscall CTestGen12CachePolicy::CheckLlcEdramCachePolicy(CTestGen12CachePolicy *this)

{
  undefined4 uVar1;
  bool bVar2;
  ulong uVar3;
  ushort uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined1 local_b8 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint local_88;
  uint32_t LeCC_WB_CACHEABLE;
  uint32_t TargetCache_LLC;
  uint32_t LeCC_WC_UNCACHEABLE;
  uint local_74;
  internal local_70 [4];
  uint32_t AssignedMocsIdx;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  undefined8 local_40;
  AssertionResult gtest_ar_10;
  
  local_88 = 1;
  LeCC_WB_CACHEABLE = 1;
  ClientRequest.IsOverridenByRegkey = 3;
  uVar6 = 0;
  do {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_b8,CommonULT::pGmmULTClientContext,uVar6 & 0xffffffff);
    local_74 = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    uVar3 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))();
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_ =
         (AssertHelperData *)(CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 6)) & 0xffffffff00000001)
    ;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.AOM",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": AOM is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    uVar7 = (undefined4)uVar3;
    local_48.data_ =
         (AssertHelperData *)
         (CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 0xf)) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.CoS",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": CoS is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_ =
         (AssertHelperData *)
         (CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 0xb)) & 0xffffffff00000007);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.PFM",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": PFM is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_ =
         (AssertHelperData *)(CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 8)) & 0xffffffff00000007)
    ;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.SCC",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": SCC is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_._0_4_ =
         (uint)((*(uint *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_1 >> 10 & 1) == 0) &
         (uint)(uVar3 >> 0xe) & 0x3ffff;
    testing::internal::CmpHelperEQ<int,int>
              (local_70,"0",
               "Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass"
               ,(int *)&local_40,(int *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": SCF is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_ =
         (AssertHelperData *)(CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 7)) & 0xffffffff00000001)
    ;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.ESC",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": ESC is non-zero",0x11);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)((ulong)local_40 & 0xffffffff00000000);
    local_48.data_ =
         (AssertHelperData *)
         (CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 0x13)) & 0xffffffff00001fff);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_70,"0","Mocs.LeCC.Reserved",(int *)&local_40,(uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": Reserved field is non-zero",0x1c);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)(ulong)(((ushort)ClientRequest.IDCode & 0x30) >> 4);
    local_48.data_ =
         (AssertHelperData *)(CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 4)) & 0xffffffff00000003)
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_70,"ClientRequest.AGE","Mocs.LeCC.LRUM",(unsigned_long *)&local_40,
               (uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": Incorrect AGE settings",0x18);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)(ulong)(ClientRequest.IDCode._2_2_ & 3);
    local_48.data_ =
         (AssertHelperData *)
         (CONCAT44(local_48.data_._4_4_,(int)(uVar3 >> 0x11)) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_70,"ClientRequest.SSO","Mocs.LeCC.SelfSnoop",(unsigned_long *)&local_40,
               (uint *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": Self Snoop is non-zero",0x18);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40 = (long *)CONCAT44(local_40._4_4_,0x40);
    testing::internal::CmpHelperGT<int,unsigned_int>
              (local_70,"(64)","AssignedMocsIdx",(int *)&local_40,&local_74);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40 + 2),": MOCS Index greater than MAX allowed (63)",0x2a);
      pcVar5 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xac,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_40 != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_40 != (long *)0x0)) {
          (**(code **)(*local_40 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = ClientRequest.IDCode._2_2_ >> 3 & 3;
    if (uVar4 == 3) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (local_70,CommonULT::pGmmULTClientContext,0x3b);
      local_48.data_._0_4_ = 0x3d;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&local_40,"AssignedMocsIdx","61",&local_74,(int *)&local_48);
      if (local_40._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,": Incorrect Index for L3Eviction type# ",0x27
                  );
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        pcVar5 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xbf,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
        if (local_48.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      TargetCache_LLC = 0;
      local_48.data_ = (AssertHelperData *)(ulong)((ushort)ClientRequest.IDCode & 1);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&local_40,"0","ClientRequest.LLC",(int *)&TargetCache_LLC,
                 (unsigned_long *)&local_48);
      if (local_40._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,
                   ": Incorrect LLC cacheability for L3Eviction type# ",0x32);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        pcVar5 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc0,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
        if (local_48.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_40,"MOCS61.Value","ClientRequest.Value",
                 (unsigned_long *)&gtest_ar,(unsigned_long *)&ClientRequest);
      if (local_40._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_48.data_)->line,": Incorrect usage for L3Eviction type# ",0x27
                  );
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
        pcVar5 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc1,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
        if (local_48.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
    }
    else if (uVar4 == 2) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (local_70,CommonULT::pGmmULTClientContext,0x3a);
      if (uVar6 == 0x3a) {
        local_48.data_._0_4_ = 0x3f;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&local_40,"AssignedMocsIdx","63",&local_74,(int *)&local_48);
        if (local_40._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,": Incorrect Index for L3Eviction type# ",
                     0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          pcVar5 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar5 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb3,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
          if (local_48.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_48.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_10,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        gtest_ar.success_ = (bool)(gtest_ar.success_ | 4);
        local_48.data_._0_4_ = 0x3f;
        testing::internal::CmpHelperNE<unsigned_int,int>
                  ((internal *)&local_40,"AssignedMocsIdx","63",&local_74,(int *)&local_48);
        if (local_40._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,": Incorrect Index for L3Eviction type# ",
                     0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          pcVar5 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar5 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb8,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
          if (local_48.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_48.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_10,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&local_40,"MOCS63.Value","ClientRequest.Value",
                   (unsigned_long *)&gtest_ar,(unsigned_long *)&ClientRequest);
        if (local_40._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_48.data_)->line,": Incorrect usage for L3Eviction type# ",
                     0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_48.data_)->line);
          pcVar5 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar5 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb9,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
          if (local_48.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_48.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_10,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    else if ((int)uVar6 == 0x39) {
      local_40 = (long *)CONCAT44(local_40._4_4_,0x3e);
      testing::internal::CmpHelperEQ<unsigned_int,int>
                (local_70,"AssignedMocsIdx","62",&local_74,(int *)&local_40);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40 + 2),": Incorrect Index for MOCS_62",0x1d);
        pcVar5 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40 != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_40 != (long *)0x0)) {
            (**(code **)(*local_40 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else if ((int)uVar6 == 0x1d) {
      local_40 = (long *)CONCAT44(local_40._4_4_,0x3c);
      testing::internal::CmpHelperEQ<unsigned_int,int>
                (local_70,"AssignedMocsIdx","60",&local_74,(int *)&local_40);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40 + 2),": Incorrect Index for CCS",0x19);
        pcVar5 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc5,pcVar5);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40 != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_40 != (long *)0x0)) {
            (**(code **)(*local_40 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else if ((ClientRequest.IDCode._2_2_ & 4) == 0) {
      local_40 = (long *)CONCAT44(local_40._4_4_,0x30);
      testing::internal::CmpHelperLT<unsigned_int,int>
                (local_70,"AssignedMocsIdx","(48)",&local_74,(int *)&local_40);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40 + 2),": Incorrect Index for HDCL1 setting",0x23);
        pcVar5 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xd2,pcVar5);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40 != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_40 != (long *)0x0)) {
            (**(code **)(*local_40 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      local_40 = (long *)CONCAT44(local_40._4_4_,0x30);
      testing::internal::CmpHelperGE<unsigned_int,int>
                (local_70,"AssignedMocsIdx","(48)",&local_74,(int *)&local_40);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40 + 2),": Incorrect Index for HDCL1 setting",0x23);
        pcVar5 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xce,pcVar5);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40 != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_40 != (long *)0x0)) {
            (**(code **)(*local_40 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (((ushort)ClientRequest.IDCode & 3) == 0) {
      local_40 = (long *)(CONCAT44(local_40._4_4_,uVar7) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_70,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",&LeCC_WB_CACHEABLE,
                 (uint *)&local_40);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40 + 2),": Incorrect LLC/eDRAM cachebility setting",0x29);
        pcVar5 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xd7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_40 != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_40 != (long *)0x0)) {
            (**(code **)(*local_40 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      uVar1 = (undefined4)(uVar3 >> 2);
      if (((ushort)ClientRequest.IDCode & 1) == 0) {
        local_40 = (long *)(CONCAT44(local_40._4_4_,uVar1) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_70,"TargetCache_LLC","Mocs.LeCC.TargetCache",&local_88,(uint *)&local_40);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40 + 2),": Incorrect target cache setting",0x20);
          pcVar5 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xe3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40 != (long *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_40 != (long *)0x0)) {
              (**(code **)(*local_40 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40 = (long *)(CONCAT44(local_40._4_4_,uVar7) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_70,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",&LeCC_WB_CACHEABLE,
                   (uint *)&local_40);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40 + 2),": Incorrect LLC cachebility setting",0x23);
          pcVar5 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xe5,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40 != (long *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_40 != (long *)0x0)) {
              (**(code **)(*local_40 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        local_40 = (long *)(CONCAT44(local_40._4_4_,uVar1) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_70,"TargetCache_LLC","Mocs.LeCC.TargetCache",&local_88,(uint *)&local_40);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40 + 2),": Incorrect target cache setting",0x20);
          pcVar5 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xdd,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40 != (long *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_40 != (long *)0x0)) {
              (**(code **)(*local_40 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40 = (long *)(CONCAT44(local_40._4_4_,uVar7) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_70,"LeCC_WB_CACHEABLE","Mocs.LeCC.Cacheability",
                   &ClientRequest.IsOverridenByRegkey,(uint *)&local_40);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40 + 2),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_40 + 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40 + 2),": Incorrect LLC cachebility setting",0x23);
          pcVar5 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar5 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xdf,pcVar5);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_40 != (long *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_40 != (long *)0x0)) {
              (**(code **)(*local_40 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x11e);
  return;
}

Assistant:

void CTestGen12CachePolicy::CheckLlcEdramCachePolicy()
{
    const uint32_t TargetCache_LLC = 1;

    const uint32_t LeCC_UNCACHEABLE    = 0x0;
    const uint32_t LeCC_WC_UNCACHEABLE = 0x1;
    const uint32_t LeCC_WB_CACHEABLE   = 0x3;
    const uint32_t LeCC_WT_CACHEABLE   = 0x2;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                        AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen12.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        // Check for unused fields
        EXPECT_EQ(0, Mocs.LeCC.AOM) << "Usage# " << Usage << ": AOM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.CoS) << "Usage# " << Usage << ": CoS is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.PFM) << "Usage# " << Usage << ": PFM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        // SCF field might be set for LKF/Gen12+ platforms;
        EXPECT_EQ(0, Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass) << "Usage# " << Usage << ": SCF is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check for age
        EXPECT_EQ(ClientRequest.AGE, Mocs.LeCC.LRUM) << "Usage# " << Usage << ": Incorrect AGE settings";

        // Check for Snoop Setting
        EXPECT_EQ(ClientRequest.SSO, Mocs.LeCC.SelfSnoop) << "Usage# " << Usage << ": Self Snoop is non-zero";

        // Check if Mocs Index is not greater than GMM_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_MAX_NUMBER_MOCS_INDEXES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (63)";

        if(ClientRequest.L3Eviction == 0x2) //63
        {
            GMM_CACHE_POLICY_ELEMENT MOCS63 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION);
            if((GMM_RESOURCE_USAGE_TYPE)Usage == GMM_RESOURCE_USAGE_L3_EVICTION)
            {
                EXPECT_EQ(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            }
            else
            {
                MOCS63.L3 = 1; //Override L3 to test , since Hw forces it to L3-uncached
                EXPECT_NE(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
                EXPECT_EQ(MOCS63.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
            }
        }
        else if(ClientRequest.L3Eviction == 0x3) //61
        {
            GMM_CACHE_POLICY_ELEMENT MOCS61 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL);
            EXPECT_EQ(AssignedMocsIdx, 61) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(0, ClientRequest.LLC) << "Usage# " << Usage << ": Incorrect LLC cacheability for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(MOCS61.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
        }
        else if(Usage == GMM_RESOURCE_USAGE_CCS) //60
        {
            EXPECT_EQ(AssignedMocsIdx, 60) << "Usage# " << Usage << ": Incorrect Index for CCS";
        }
        else if(Usage == GMM_RESOURCE_USAGE_MOCS_62) //62
        {
            EXPECT_EQ(AssignedMocsIdx, 62) << "Usage# " << Usage << ": Incorrect Index for MOCS_62";
        }
        // Check of assigned Index setting is appropriate for HDCL1 setting
        else if(ClientRequest.HDCL1)
        {
            EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }
        else
        {
            EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }

        if(!ClientRequest.LLC && !ClientRequest.ELLC) // Uncached
        {
            EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";
        }
        else
        {
            if(ClientRequest.LLC) // LLC only
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WB_CACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
            else
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
        }
    }
}